

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_shaderiv(NegativeTestContext *ctx)

{
  ostringstream *this;
  GLuint shader;
  GLuint shader_00;
  char *pcVar1;
  allocator<char> local_1a6;
  GLboolean shaderCompilerSupported;
  GLint param [1];
  MessageBuilder local_1a0;
  
  shader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  param[0] = -1;
  glu::CallLogWrapper::glGetBooleanv(&ctx->super_CallLogWrapper,0x8dfa,&shaderCompilerSupported);
  local_1a0.m_log = (ctx->super_CallLogWrapper).m_log;
  this = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,"// GL_SHADER_COMPILER = ");
  pcVar1 = "GL_TRUE";
  if (shaderCompilerSupported == '\0') {
    pcVar1 = "GL_FALSE";
  }
  std::operator<<((ostream *)this,pcVar1);
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"GL_INVALID_ENUM is generated if pname is not an accepted value.",
             &local_1a6);
  NegativeTestContext::beginSection(ctx,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  glu::CallLogWrapper::glGetShaderiv(&ctx->super_CallLogWrapper,shader,0xffffffff,param);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,
             "GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.",
             &local_1a6);
  NegativeTestContext::beginSection(ctx,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  glu::CallLogWrapper::glGetShaderiv(&ctx->super_CallLogWrapper,0xffffffff,0x8b4f,param);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,
             "GL_INVALID_OPERATION is generated if shader does not refer to a shader object.",
             &local_1a6);
  NegativeTestContext::beginSection(ctx,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  glu::CallLogWrapper::glGetShaderiv(&ctx->super_CallLogWrapper,shader_00,0x8b4f,param);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,shader_00);
  return;
}

Assistant:

void get_shaderiv (NegativeTestContext& ctx)
{
	GLboolean	shaderCompilerSupported;
	GLuint		shader		= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLuint		program		= ctx.glCreateProgram();
	GLint		param[1]	= { -1 };

	ctx.glGetBooleanv(GL_SHADER_COMPILER, &shaderCompilerSupported);
	ctx.getLog() << TestLog::Message << "// GL_SHADER_COMPILER = " << (shaderCompilerSupported ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted value.");
	ctx.glGetShaderiv(shader, -1, &param[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.");
	ctx.glGetShaderiv(-1, GL_SHADER_TYPE, &param[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader does not refer to a shader object.");
	ctx.glGetShaderiv(program, GL_SHADER_TYPE, &param[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteShader(shader);
	ctx.glDeleteProgram(program);
}